

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utIOSystem.cpp
# Opt level: O0

void __thiscall
IOSystemTest_accessDirectoryStackTest_Test::~IOSystemTest_accessDirectoryStackTest_Test
          (IOSystemTest_accessDirectoryStackTest_Test *this)

{
  IOSystemTest_accessDirectoryStackTest_Test *this_local;
  
  ~IOSystemTest_accessDirectoryStackTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F( IOSystemTest, accessDirectoryStackTest ) {
    EXPECT_FALSE( pImp->PopDirectory() );
    EXPECT_EQ( 0U, pImp->StackSize() );
    EXPECT_FALSE( pImp->PushDirectory( "" ) );
    std::string path = "test/";
    EXPECT_TRUE( pImp->PushDirectory( path ) );
    EXPECT_EQ( 1U, pImp->StackSize() );
    EXPECT_EQ( path, pImp->CurrentDirectory() );
    EXPECT_TRUE( pImp->PopDirectory() );
    EXPECT_EQ( 0U, pImp->StackSize() );
}